

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

PolicyStatus __thiscall
cmStateSnapshot::GetPolicy(cmStateSnapshot *this,PolicyID id,bool parent_scope)

{
  iterator other;
  bool bVar1;
  PolicyStatus PVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pPVar5;
  iterator other_00;
  iterator dir;
  iterator leaf;
  PositionType p;
  PositionType e;
  iterator local_78;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  
  PVar2 = cmPolicies::GetPolicyStatus(id);
  if (1 < PVar2 - REQUIRED_IF_USED) {
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
    local_78.Tree = (pSVar3->BuildSystemDirectory).Tree;
    local_78.Position = (pSVar3->BuildSystemDirectory).Position;
    while( true ) {
      if ((local_78.Tree == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) ||
         ((ulong)(((long)((local_78.Tree)->Data).
                         super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((local_78.Tree)->Data).
                        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x208) < local_78.Position)) {
        __assert_fail("dir.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateSnapshot.cxx"
                      ,0xb5,
                      "cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID, bool) const"
                     );
      }
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_78);
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar4->DirectoryEnd);
      local_68.Tree = (pSVar3->Policies).Tree;
      local_68.Position = (pSVar3->Policies).Position;
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_78);
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&pBVar4->DirectoryEnd);
      other = pSVar3->PolicyRoot;
      while (bVar1 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=
                               (&local_68,other), bVar1) {
        if ((parent_scope & 1U) == 0) {
          pPVar5 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_68);
          bVar1 = cmPolicies::PolicyMap::IsDefined(&pPVar5->super_PolicyMap,id);
          if (bVar1) {
            pPVar5 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator->(&local_68);
            PVar2 = cmPolicies::PolicyMap::Get(&pPVar5->super_PolicyMap,id);
            return PVar2;
          }
        }
        cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++(&local_68);
        parent_scope = false;
      }
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&local_78);
      local_48.Tree = (pBVar4->DirectoryEnd).Tree;
      local_48.Position = (pBVar4->DirectoryEnd).Position;
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
      local_58.Tree = (pSVar3->DirectoryParent).Tree;
      local_58.Position = (pSVar3->DirectoryParent).Position;
      other_00.Tree = &this->State->SnapshotData;
      other_00.Position = 0;
      bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                        (&local_58,other_00);
      if (bVar1) break;
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      local_78.Tree = (pSVar3->BuildSystemDirectory).Tree;
      local_78.Position = (pSVar3->BuildSystemDirectory).Position;
    }
  }
  return PVar2;
}

Assistant:

cmPolicies::PolicyStatus cmStateSnapshot::GetPolicy(cmPolicies::PolicyID id,
                                                    bool parent_scope) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if (status == cmPolicies::REQUIRED_ALWAYS ||
      status == cmPolicies::REQUIRED_IF_USED) {
    return status;
  }

  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator dir =
    this->Position->BuildSystemDirectory;

  while (true) {
    assert(dir.IsValid());
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator leaf =
      dir->DirectoryEnd->Policies;
    cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator root =
      dir->DirectoryEnd->PolicyRoot;
    for (; leaf != root; ++leaf) {
      if (parent_scope) {
        parent_scope = false;
        continue;
      }
      if (leaf->IsDefined(id)) {
        status = leaf->Get(id);
        return status;
      }
    }
    cmStateDetail::PositionType e = dir->DirectoryEnd;
    cmStateDetail::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root()) {
      break;
    }
    dir = p->BuildSystemDirectory;
  }
  return status;
}